

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

ostream * helics::operator<<(ostream *out,ActionMessage *command)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ActionMessage *in_stack_00000270;
  string local_30 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_8 = in_RDI;
  prettyPrintString_abi_cxx11_(in_stack_00000270);
  std::operator<<((ostream *)in_RDI,local_30);
  std::__cxx11::string::~string(in_RDI);
  return (ostream *)local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ActionMessage& command)
{
    out << prettyPrintString(command);
    return out;
}